

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

bool __thiscall
FBehavior::CopyStringToArray(FBehavior *this,int arraynum,int index,int maxLength,char *string)

{
  ArrayInfo *pAVar1;
  ulong uVar2;
  int iVar3;
  bool bVar4;
  
  bVar4 = false;
  if ((-1 < index) && (bVar4 = false, (uint)arraynum < (uint)this->NumTotalArrays)) {
    pAVar1 = this->Arrays[arraynum];
    iVar3 = pAVar1->ArraySize - index;
    if (maxLength <= iVar3) {
      iVar3 = maxLength;
    }
    uVar2 = (ulong)(uint)index;
    while( true ) {
      if (iVar3 < 1) break;
      pAVar1->Elements[uVar2] = (int)*string;
      if (*string == '\0') {
        return true;
      }
      uVar2 = uVar2 + 1;
      string = string + 1;
      iVar3 = iVar3 + -1;
    }
    bVar4 = *string == '\0';
  }
  return bVar4;
}

Assistant:

inline bool FBehavior::CopyStringToArray(int arraynum, int index, int maxLength, const char *string)
{
	 // false if the operation was incomplete or unsuccessful

	if ((unsigned)arraynum >= (unsigned)NumTotalArrays || index < 0)
		return false;
	const ArrayInfo *array = Arrays[arraynum];
	
	if ((signed)array->ArraySize - index < maxLength) maxLength = (signed)array->ArraySize - index;

	while (maxLength-- > 0)
	{
		array->Elements[index++] = *string;
		if (!(*string)) return true; // written terminating 0
		string++;
	}
	return !(*string); // return true if only terminating 0 was not written
}